

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argengine.cpp
# Opt level: O1

void __thiscall juzzlin::Argengine::Impl::printHelp(Impl *this)

{
  size_type *psVar1;
  _Manager_type p_Var2;
  long lVar3;
  char cVar4;
  pointer ppVar5;
  pointer ppVar6;
  pointer ppVar7;
  pointer psVar8;
  ostream *poVar9;
  long *plVar10;
  ulong uVar11;
  undefined8 *puVar12;
  ulong *puVar13;
  size_type sVar14;
  undefined8 uVar15;
  ulong uVar16;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *optionText;
  pointer psVar17;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> variantsString;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  helpTexts;
  OptionDefinitionVector sortedOptionDefinitions;
  ulong *local_108;
  long local_100;
  ulong local_f8;
  long lStack_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_c8;
  vector<std::shared_ptr<juzzlin::Argengine::Impl::OptionDefinition>,_std::allocator<std::shared_ptr<juzzlin::Argengine::Impl::OptionDefinition>_>_>
  local_b0;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_98;
  pointer local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  sVar14 = (this->m_helpText)._M_string_length;
  if (sVar14 != 0) {
    poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                       (this->m_out,(this->m_helpText)._M_dataplus._M_p,sVar14);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) + (char)poVar9);
    std::ostream::put((char)poVar9);
    plVar10 = (long *)std::ostream::flush();
    std::ios::widen((char)*(undefined8 *)(*plVar10 + -0x18) + (char)plVar10);
    std::ostream::put((char)plVar10);
    std::ostream::flush();
  }
  poVar9 = this->m_out;
  std::__ostream_insert<char,std::char_traits<char>>(poVar9,"Options:",8);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) + (char)poVar9);
  std::ostream::put((char)poVar9);
  plVar10 = (long *)std::ostream::flush();
  std::ios::widen((char)*(undefined8 *)(*plVar10 + -0x18) + (char)plVar10);
  std::ostream::put((char)plVar10);
  std::ostream::flush();
  std::
  vector<std::shared_ptr<juzzlin::Argengine::Impl::OptionDefinition>,_std::allocator<std::shared_ptr<juzzlin::Argengine::Impl::OptionDefinition>_>_>
  ::vector(&local_b0,&this->m_optionDefinitions);
  psVar8 = local_b0.
           super__Vector_base<std::shared_ptr<juzzlin::Argengine::Impl::OptionDefinition>,_std::allocator<std::shared_ptr<juzzlin::Argengine::Impl::OptionDefinition>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  psVar17 = local_b0.
            super__Vector_base<std::shared_ptr<juzzlin::Argengine::Impl::OptionDefinition>,_std::allocator<std::shared_ptr<juzzlin::Argengine::Impl::OptionDefinition>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if ((this->m_helpSorting == Ascending) &&
     (local_b0.
      super__Vector_base<std::shared_ptr<juzzlin::Argengine::Impl::OptionDefinition>,_std::allocator<std::shared_ptr<juzzlin::Argengine::Impl::OptionDefinition>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_b0.
      super__Vector_base<std::shared_ptr<juzzlin::Argengine::Impl::OptionDefinition>,_std::allocator<std::shared_ptr<juzzlin::Argengine::Impl::OptionDefinition>_>_>
      ._M_impl.super__Vector_impl_data._M_finish)) {
    uVar11 = (long)local_b0.
                   super__Vector_base<std::shared_ptr<juzzlin::Argengine::Impl::OptionDefinition>,_std::allocator<std::shared_ptr<juzzlin::Argengine::Impl::OptionDefinition>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)local_b0.
                   super__Vector_base<std::shared_ptr<juzzlin::Argengine::Impl::OptionDefinition>,_std::allocator<std::shared_ptr<juzzlin::Argengine::Impl::OptionDefinition>_>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 4;
    lVar3 = 0x3f;
    if (uVar11 != 0) {
      for (; uVar11 >> lVar3 == 0; lVar3 = lVar3 + -1) {
      }
    }
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<std::shared_ptr<juzzlin::Argengine::Impl::OptionDefinition>*,std::vector<std::shared_ptr<juzzlin::Argengine::Impl::OptionDefinition>,std::allocator<std::shared_ptr<juzzlin::Argengine::Impl::OptionDefinition>>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<juzzlin::Argengine::Impl::printHelp()const::_lambda(std::shared_ptr<juzzlin::Argengine::Impl::OptionDefinition>const&,std::shared_ptr<juzzlin::Argengine::Impl::OptionDefinition>const&)_1_>>
              (local_b0.
               super__Vector_base<std::shared_ptr<juzzlin::Argengine::Impl::OptionDefinition>,_std::allocator<std::shared_ptr<juzzlin::Argengine::Impl::OptionDefinition>_>_>
               ._M_impl.super__Vector_impl_data._M_start,
               local_b0.
               super__Vector_base<std::shared_ptr<juzzlin::Argengine::Impl::OptionDefinition>,_std::allocator<std::shared_ptr<juzzlin::Argengine::Impl::OptionDefinition>_>_>
               ._M_impl.super__Vector_impl_data._M_finish,((uint)lVar3 ^ 0x3f) * 2 ^ 0x7e);
    std::
    __final_insertion_sort<__gnu_cxx::__normal_iterator<std::shared_ptr<juzzlin::Argengine::Impl::OptionDefinition>*,std::vector<std::shared_ptr<juzzlin::Argengine::Impl::OptionDefinition>,std::allocator<std::shared_ptr<juzzlin::Argengine::Impl::OptionDefinition>>>>,__gnu_cxx::__ops::_Iter_comp_iter<juzzlin::Argengine::Impl::printHelp()const::_lambda(std::shared_ptr<juzzlin::Argengine::Impl::OptionDefinition>const&,std::shared_ptr<juzzlin::Argengine::Impl::OptionDefinition>const&)_1_>>
              (psVar17,psVar8);
  }
  local_c8.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_c8.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_c8.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_58 = local_b0.
             super__Vector_base<std::shared_ptr<juzzlin::Argengine::Impl::OptionDefinition>,_std::allocator<std::shared_ptr<juzzlin::Argengine::Impl::OptionDefinition>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  if (local_b0.
      super__Vector_base<std::shared_ptr<juzzlin::Argengine::Impl::OptionDefinition>,_std::allocator<std::shared_ptr<juzzlin::Argengine::Impl::OptionDefinition>_>_>
      ._M_impl.super__Vector_impl_data._M_start ==
      local_b0.
      super__Vector_base<std::shared_ptr<juzzlin::Argengine::Impl::OptionDefinition>,_std::allocator<std::shared_ptr<juzzlin::Argengine::Impl::OptionDefinition>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    sVar14 = 2;
    ppVar5 = local_c8.
             super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    ppVar6 = local_c8.
             super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  }
  else {
    uVar11 = 0;
    psVar17 = local_b0.
              super__Vector_base<std::shared_ptr<juzzlin::Argengine::Impl::OptionDefinition>,_std::allocator<std::shared_ptr<juzzlin::Argengine::Impl::OptionDefinition>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    do {
      OptionDefinition::getVariantsString_abi_cxx11_
                (&local_98.first,
                 (psVar17->
                 super___shared_ptr<juzzlin::Argengine::Impl::OptionDefinition,_(__gnu_cxx::_Lock_policy)2>
                 )._M_ptr);
      p_Var2 = (((psVar17->
                 super___shared_ptr<juzzlin::Argengine::Impl::OptionDefinition,_(__gnu_cxx::_Lock_policy)2>
                 )._M_ptr)->singleStringCallback).super__Function_base._M_manager;
      if (p_Var2 == (_Manager_type)0x0) {
        local_108 = &local_f8;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_108,"");
      }
      else {
        std::operator+(&local_50," [",
                       &((psVar17->
                         super___shared_ptr<juzzlin::Argengine::Impl::OptionDefinition,_(__gnu_cxx::_Lock_policy)2>
                         )._M_ptr)->valueName);
        plVar10 = (long *)std::__cxx11::string::append((char *)&local_50);
        local_108 = &local_f8;
        puVar13 = (ulong *)(plVar10 + 2);
        if ((ulong *)*plVar10 == puVar13) {
          local_f8 = *puVar13;
          lStack_f0 = plVar10[3];
        }
        else {
          local_f8 = *puVar13;
          local_108 = (ulong *)*plVar10;
        }
        local_100 = plVar10[1];
        *plVar10 = (long)puVar13;
        plVar10[1] = 0;
        *(undefined1 *)(plVar10 + 2) = 0;
      }
      uVar15 = 0xf;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_98.first._M_dataplus._M_p != &local_98.first.field_2) {
        uVar15 = local_98.first.field_2._M_allocated_capacity;
      }
      if ((ulong)uVar15 < local_100 + local_98.first._M_string_length) {
        uVar16 = 0xf;
        if (local_108 != &local_f8) {
          uVar16 = local_f8;
        }
        if (uVar16 < local_100 + local_98.first._M_string_length) goto LAB_0010a8a8;
        puVar12 = (undefined8 *)
                  std::__cxx11::string::replace
                            ((ulong)&local_108,0,(char *)0x0,(ulong)local_98.first._M_dataplus._M_p)
        ;
      }
      else {
LAB_0010a8a8:
        puVar12 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_98,(ulong)local_108);
      }
      local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
      psVar1 = puVar12 + 2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*puVar12 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar1) {
        local_e8.field_2._M_allocated_capacity = *psVar1;
        local_e8.field_2._8_8_ = puVar12[3];
      }
      else {
        local_e8.field_2._M_allocated_capacity = *psVar1;
        local_e8._M_dataplus._M_p = (pointer)*puVar12;
      }
      local_e8._M_string_length = puVar12[1];
      *puVar12 = psVar1;
      puVar12[1] = 0;
      *(undefined1 *)psVar1 = 0;
      if (local_108 != &local_f8) {
        operator_delete(local_108,local_f8 + 1);
      }
      if ((p_Var2 != (_Manager_type)0x0) &&
         ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2)) {
        operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_98.first._M_dataplus._M_p != &local_98.first.field_2) {
        operator_delete(local_98.first._M_dataplus._M_p,
                        local_98.first.field_2._M_allocated_capacity + 1);
      }
      if (uVar11 < local_e8._M_string_length) {
        uVar11 = local_e8._M_string_length;
      }
      std::
      pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::
      pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_true>
                (&local_98,&local_e8,
                 &((psVar17->
                   super___shared_ptr<juzzlin::Argengine::Impl::OptionDefinition,_(__gnu_cxx::_Lock_policy)2>
                   )._M_ptr)->infoText);
      std::
      vector<std::pair<std::__cxx11::string,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string,std::__cxx11::string>>>
      ::emplace_back<std::pair<std::__cxx11::string,std::__cxx11::string>>
                ((vector<std::pair<std::__cxx11::string,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string,std::__cxx11::string>>>
                  *)&local_c8,&local_98);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_98.second._M_dataplus._M_p != &local_98.second.field_2) {
        operator_delete(local_98.second._M_dataplus._M_p,
                        local_98.second.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_98.first._M_dataplus._M_p != &local_98.first.field_2) {
        operator_delete(local_98.first._M_dataplus._M_p,
                        local_98.first.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
        operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
      }
      psVar17 = psVar17 + 1;
    } while (psVar17 != local_58);
    sVar14 = uVar11 + 2;
    ppVar5 = local_c8.
             super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    ppVar6 = local_c8.
             super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  }
  for (; ppVar7 = local_c8.
                  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish,
      ppVar5 != local_c8.
                super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish; ppVar5 = ppVar5 + 1) {
    local_c8.
    super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = ppVar6;
    std::__ostream_insert<char,std::char_traits<char>>
              (this->m_out,(ppVar5->first)._M_dataplus._M_p,(ppVar5->first)._M_string_length);
    if (sVar14 != (ppVar5->first)._M_string_length) {
      uVar11 = 0;
      do {
        std::__ostream_insert<char,std::char_traits<char>>(this->m_out," ",1);
        uVar11 = uVar11 + 1;
      } while (uVar11 < sVar14 - (ppVar5->first)._M_string_length);
    }
    std::__ostream_insert<char,std::char_traits<char>>
              (this->m_out,(ppVar5->second)._M_dataplus._M_p,(ppVar5->second)._M_string_length);
    cVar4 = (char)this->m_out;
    std::ios::widen((char)*(undefined8 *)(*(long *)this->m_out + -0x18) + cVar4);
    std::ostream::put(cVar4);
    std::ostream::flush();
    ppVar6 = local_c8.
             super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    local_c8.
    super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = ppVar7;
  }
  cVar4 = (char)this->m_out;
  local_c8.
  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = ppVar6;
  std::ios::widen((char)*(undefined8 *)(*(long *)this->m_out + -0x18) + cVar4);
  std::ostream::put(cVar4);
  std::ostream::flush();
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~vector(&local_c8);
  std::
  vector<std::shared_ptr<juzzlin::Argengine::Impl::OptionDefinition>,_std::allocator<std::shared_ptr<juzzlin::Argengine::Impl::OptionDefinition>_>_>
  ::~vector(&local_b0);
  return;
}

Assistant:

void printHelp() const
    {
        if (!m_helpText.empty()) {
            *m_out << m_helpText << std::endl
                   << std::endl;
        }

        *m_out << "Options:" << std::endl
               << std::endl;

        auto sortedOptionDefinitions = m_optionDefinitions;
        if (m_helpSorting == HelpSorting::Ascending) {
            std::sort(sortedOptionDefinitions.begin(), sortedOptionDefinitions.end(), [](const OptionDefinitionSP & l, const OptionDefinitionSP & r) {
                return l->getVariantsString() < r->getVariantsString();
            });
        }

        using ArgumentAndHelpText = std::pair<std::string, std::string>;
        std::vector<ArgumentAndHelpText> helpTexts;
        size_t maxLength = 0;
        for (auto && option : sortedOptionDefinitions) {
            const auto variantsString = option->getVariantsString() + (option->singleStringCallback ? " [" + option->valueName + "]" : "");
            maxLength = std::max(variantsString.size(), maxLength);
            helpTexts.push_back({ variantsString, option->infoText });
        }
        const size_t margin = 2;
        for (auto && optionText : helpTexts) {
            *m_out << optionText.first;
            for (size_t i = 0; i < maxLength + margin - optionText.first.size(); i++) {
                *m_out << " ";
            }
            *m_out << optionText.second;
            *m_out << std::endl;
        }
        *m_out << std::endl;
    }